

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O1

Value * DumpToJsonArray(Value *__return_storage_ptr__,
                       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *values)

{
  _Rb_tree_node_base *p_Var1;
  Value VStack_48;
  
  Json::Value::Value(__return_storage_ptr__,arrayValue);
  for (p_Var1 = (values->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(values->_M_t)._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    Json::Value::Value(&VStack_48,(String *)(p_Var1 + 1));
    Json::Value::append(__return_storage_ptr__,&VStack_48);
    Json::Value::~Value(&VStack_48);
  }
  return __return_storage_ptr__;
}

Assistant:

static Json::Value DumpToJsonArray(const std::set<std::string>& values)
{
  Json::Value jsonArray = Json::arrayValue;
  for (const auto& it : values) {
    jsonArray.append(it);
  }
  return jsonArray;
}